

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::ExpressionLhs<bool>::reconstructExpression(ExpressionLhs<bool> *this,string *dest)

{
  char *pcVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pcVar1 = "false";
  if ((ulong)this->m_truthy != 0) {
    pcVar1 = "true";
  }
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,pcVar1,pcVar1 + ((ulong)this->m_truthy ^ 5));
  std::__cxx11::string::operator=((string *)dest,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

virtual void reconstructExpression( std::string& dest ) const CATCH_OVERRIDE {
        dest = Catch::toString( m_truthy );
    }